

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

u8 dec_is_separate_tree(int w,int h,com_split_mode_t split)

{
  bool bVar1;
  bool bVar2;
  
  switch(split) {
  case SPLIT_BI_VER:
  case SPLIT_QUAD:
    bVar1 = w == 8;
    break;
  case SPLIT_BI_HOR:
    bVar1 = h == 8;
    break;
  case SPLIT_EQT_VER:
    bVar1 = w == 0x10;
    bVar2 = h == 8;
    goto LAB_0010cd1c;
  case SPLIT_EQT_HOR:
    bVar1 = h == 0x10;
    bVar2 = w == 8;
LAB_0010cd1c:
    return bVar2 | bVar1;
  default:
    return '\0';
  }
  return bVar1;
}

Assistant:

u8 dec_is_separate_tree(int w, int h, com_split_mode_t split)
{
    if (split == SPLIT_QUAD) {
        return (w == 8);
    }
    else if (split == SPLIT_EQT_HOR) {
        return (h == 16 || w == 8);
    }
    else if (split == SPLIT_EQT_VER) {
        return (w == 16 || h == 8);
    }
    else if (split == SPLIT_BI_HOR) {
        return (h == 8);
    }
    else if (split == SPLIT_BI_VER) {
        return (w == 8);
    }
    else {
        return 0;
    }
}